

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O0

void update_palette_cdf(MACROBLOCKD *xd,MB_MODE_INFO *mbmi,FRAME_COUNTS *counts)

{
  BLOCK_SIZE BVar1;
  FRAME_CONTEXT *pFVar2;
  int iVar3;
  int iVar4;
  BLOCK_SIZE *in_RSI;
  MACROBLOCKD *in_RDI;
  int palette_uv_mode_ctx;
  int n_1;
  int palette_mode_ctx;
  int n;
  int palette_bsize_ctx;
  PALETTE_MODE_INFO *pmi;
  BLOCK_SIZE bsize;
  FRAME_CONTEXT *fc;
  
  pFVar2 = in_RDI->tile_ctx;
  iVar3 = av1_get_palette_bsize_ctx(*in_RSI);
  if (in_RSI[2] == BLOCK_4X4) {
    BVar1 = in_RSI[0x8e];
    iVar4 = av1_get_palette_mode_ctx(in_RDI);
    update_cdf(pFVar2->palette_y_mode_cdf[iVar3][iVar4],BVar1 != BLOCK_4X4,2);
    if (BVar1 != BLOCK_4X4) {
      update_cdf(pFVar2->palette_y_size_cdf[iVar3],BVar1 - BLOCK_8X4,7);
    }
  }
  if (in_RSI[3] == BLOCK_4X4) {
    BVar1 = in_RSI[0x8f];
    update_cdf(pFVar2->palette_uv_mode_cdf[(int)(uint)(in_RSI[0x8e] != BLOCK_4X4)],
               BVar1 != BLOCK_4X4,2);
    if (BVar1 != BLOCK_4X4) {
      update_cdf(pFVar2->palette_uv_size_cdf[iVar3],BVar1 - BLOCK_8X4,7);
    }
  }
  return;
}

Assistant:

static void update_palette_cdf(MACROBLOCKD *xd, const MB_MODE_INFO *const mbmi,
                               FRAME_COUNTS *counts) {
  FRAME_CONTEXT *fc = xd->tile_ctx;
  const BLOCK_SIZE bsize = mbmi->bsize;
  const PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
  const int palette_bsize_ctx = av1_get_palette_bsize_ctx(bsize);

  (void)counts;

  if (mbmi->mode == DC_PRED) {
    const int n = pmi->palette_size[0];
    const int palette_mode_ctx = av1_get_palette_mode_ctx(xd);

#if CONFIG_ENTROPY_STATS
    ++counts->palette_y_mode[palette_bsize_ctx][palette_mode_ctx][n > 0];
#endif
    update_cdf(fc->palette_y_mode_cdf[palette_bsize_ctx][palette_mode_ctx],
               n > 0, 2);
    if (n > 0) {
#if CONFIG_ENTROPY_STATS
      ++counts->palette_y_size[palette_bsize_ctx][n - PALETTE_MIN_SIZE];
#endif
      update_cdf(fc->palette_y_size_cdf[palette_bsize_ctx],
                 n - PALETTE_MIN_SIZE, PALETTE_SIZES);
    }
  }

  if (mbmi->uv_mode == UV_DC_PRED) {
    const int n = pmi->palette_size[1];
    const int palette_uv_mode_ctx = (pmi->palette_size[0] > 0);

#if CONFIG_ENTROPY_STATS
    ++counts->palette_uv_mode[palette_uv_mode_ctx][n > 0];
#endif
    update_cdf(fc->palette_uv_mode_cdf[palette_uv_mode_ctx], n > 0, 2);

    if (n > 0) {
#if CONFIG_ENTROPY_STATS
      ++counts->palette_uv_size[palette_bsize_ctx][n - PALETTE_MIN_SIZE];
#endif
      update_cdf(fc->palette_uv_size_cdf[palette_bsize_ctx],
                 n - PALETTE_MIN_SIZE, PALETTE_SIZES);
    }
  }
}